

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O0

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,NumberExpression *expression)

{
  ostream *poVar1;
  NumericConstant *this_00;
  string local_40;
  NumberExpression *local_20;
  NumberExpression *expression_local;
  Expression *parent_local;
  PrintVisitor *this_local;
  
  poVar1 = this->mStream;
  local_20 = expression;
  expression_local = (NumberExpression *)parent;
  parent_local = (Expression *)this;
  this_00 = NumberExpression::value(expression);
  NumericConstant::toString_abi_cxx11_(&local_40,this_00);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, NumberExpression* expression) {
	mStream << expression->value().toString();
}